

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeLiteGenerator::GetRebuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  cmXMLSafe local_30;
  
  GetCleanCommand_abi_cxx11_(&local_70,this,mf);
  cmXMLSafe::cmXMLSafe(&local_30," && ");
  cmXMLSafe::str_abi_cxx11_(&local_90,&local_30);
  std::operator+(&local_50,&local_70,&local_90);
  GetBuildCommand_abi_cxx11_(&local_b0,this,mf);
  std::operator+(__return_storage_ptr__,&local_50,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraCodeLiteGenerator::GetRebuildCommand(const cmMakefile* mf) const
{
  return GetCleanCommand(mf) + cmXMLSafe(" && ").str() + GetBuildCommand(mf);
}